

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver.cpp
# Opt level: O0

void __thiscall
Laplace2DProblem_heat_Test::~Laplace2DProblem_heat_Test(Laplace2DProblem_heat_Test *this)

{
  Laplace2DProblem_heat_Test *this_local;
  
  ~Laplace2DProblem_heat_Test(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

TEST_F(Laplace2DProblem, heat) {

  // Solver_Config data;
  // data.type = Solver_Type::jacobi;

  // data.maximum_iterations = 1000;
  // data.convergence_tolerance = 1.0e-11;

  // int size = 40;
  // const int size_xy = size*size;
  // construct_2D_laplace_source(size);
  // FOR(i_node, x_vector.size())  x_vector[i_node] = analytical_solution(i_node, size);

  // // writeout
  // FOR(i_row, size_xy) {
  //   //std::cout <<"\n|";
  //   //FOR(i_column, size_xy) {
  //   //  if(a_matrix_0.contains(i_row, i_column)) std::cout<<std::setw(7)<<a_matrix_0[i_row][i_column];
  //   //  else std::cout<<"      .";
  //   //}
  //   //std::cout <<"|";
  //   //std::cout<<std::setw(7)<<x_vector[i_row];
  //   //if(i_row%(i_row/2) == 0) std::cout<<" = ";
  //   //std::cout<<"   ";
  //   //std::cout<<std::setw(7)<<b_vector_0[i_row];
  // }

  // //std::cout<<"\n";
  // Vector_Dense<0> residual_0 = a_sparse_0*x_vector - b_vector_0;
  // std::cout<<"\n"<<lp_norm<2>(residual_0);
  // //FOR(i_node, x_vector.size()) {
  // //  std::cout<<" "<<residual_0[i_node];
  // //}

  // Solver solver = build_solver(data);
  // Convergence_Data result = solver.solve(a_sparse_0, x_vector, b_vector_0);
  // std::cout<<"\nSOR: "<<result.iteration<<"\t"<<result.residual;

  // std::cout<<"\n";
  // std::vector<Scalar> residual(size_xy, std::numeric_limits<Scalar>::max());
  // residual_0 = a_sparse_0*x_vector - b_vector_0;
  // FOR(i_node, x_vector.size()) {
  //   residual[i_node] = x_vector[i_node] - analytical_solution(i_node, size);
  //   std::cout<<x_vector[i_node]<<" | "<<analytical_solution(i_node, size)<<"\n";
  // }
  // std::cout<<"\n";
}